

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

QTextStream * __thiscall QTextStream::operator<<(QTextStream *this,char c)

{
  QTextStreamPrivate *this_00;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  QTextStreamPrivate *d;
  char *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  int line;
  undefined6 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb6;
  QTextStream *local_30;
  QMessageLogger local_28;
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTextStream *)0x4abe41);
  if ((this_00->string == (QString *)0x0) && (this_00->device == (QIODevice *)0x0)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT26(in_stack_ffffffffffffffb6,in_stack_ffffffffffffffb0),
               (char *)in_RDI,line,in_stack_ffffffffffffff98);
    QMessageLogger::warning(&local_28,"QTextStream: No device");
    local_30 = in_RDI;
  }
  else {
    QChar::fromLatin1((char)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    QTextStreamPrivate::putChar(this_00,(QChar)(char16_t)((ulong)in_RDI >> 0x30));
    local_30 = in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator<<(char c)
{
    Q_D(QTextStream);
    CHECK_VALID_STREAM(*this);
    d->putChar(QChar::fromLatin1(c));
    return *this;
}